

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 *handler)

{
  uint uVar1;
  undefined1 value [16];
  undefined1 value_00 [16];
  buffer_appender<char> out;
  buffer_appender<char> out_00;
  error_handler eVar2;
  error_handler *begin_00;
  int in_ECX;
  ulong uVar3;
  char *begin_01;
  error_handler *this;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  buffer<char> *local_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  void *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined1 local_58 [8];
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
  adapter;
  format_arg arg;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::on_text(handler,(char *)begin_00,begin + 2);
    goto LAB_00231138;
  }
  if (*begin_00 != (error_handler)0x7d) {
    adapter.handler._0_4_ = 0;
    this = begin_00;
    local_58 = (undefined1  [8])handler;
    begin_00 = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>&,char>&>
                         ((char *)begin_00,end,
                          (id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_&,_char>
                           *)local_58);
    if (begin_00 == (error_handler *)end) {
      eVar2 = (error_handler)0x0;
    }
    else {
      eVar2 = *begin_00;
    }
    if (eVar2 == (error_handler)0x3a) {
      begin_00 = (error_handler *)
                 format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                 ::on_format_specs(handler,(uint)adapter.handler,(char *)(begin_00 + 1),end);
      if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
        error_handler::on_error((error_handler *)handler,"unknown format specifier");
      }
      goto LAB_00231138;
    }
    if (eVar2 != (error_handler)0x7d) {
      error_handler::on_error(this,"missing \'}\' in format string");
    }
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)&adapter.arg_id,(detail *)&handler->context,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)
               (ulong)(uint)adapter.handler,in_ECX);
    if (0xe < arg.value_.field_0.int128_value._8_4_ - 1) goto LAB_00231172;
    local_98 = (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
               container;
    switch(arg.value_.field_0.int128_value._8_4_) {
    case 2:
      goto switchD_00230f34_caseD_2;
    case 3:
      goto switchD_00230f34_caseD_3;
    case 4:
      goto switchD_00230f34_caseD_4;
    case 5:
      goto switchD_00230f34_caseD_5;
    case 6:
      goto switchD_00230f34_caseD_6;
    case 7:
      goto switchD_00230f34_caseD_7;
    case 8:
      goto switchD_00230f34_caseD_8;
    case 9:
      goto switchD_00230f34_caseD_9;
    case 10:
      goto switchD_00230f34_caseD_a;
    case 0xb:
      goto switchD_00230f34_caseD_b;
    case 0xc:
      goto switchD_00230f34_caseD_c;
    case 0xd:
      goto switchD_00230f34_caseD_d;
    case 0xe:
      goto switchD_00230f34_caseD_e;
    case 0xf:
      goto switchD_00230f34_caseD_f;
    }
switchD_00230f34_caseD_1:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_int,_0>
                         ((buffer_appender<char>)local_98,adapter.arg_id);
    goto LAB_00231135;
  }
  uVar1 = (handler->parse_context).next_arg_id_;
  if ((int)uVar1 < 0) {
    error_handler::on_error
              ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
  }
  (handler->parse_context).next_arg_id_ = uVar1 + 1;
  get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
            ((format_arg *)&adapter.arg_id,(detail *)&handler->context,
             (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)uVar1,
             in_ECX);
  if (0xe < arg.value_.field_0.int128_value._8_4_ - 1) {
LAB_00231172:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                ,0x6d7,"");
  }
  local_98 = (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
             container;
  switch(arg.value_.field_0.int128_value._8_4_) {
  case 1:
    goto switchD_00230f34_caseD_1;
  case 2:
switchD_00230f34_caseD_2:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                         ((buffer_appender<char>)local_98,adapter.arg_id);
    break;
  case 3:
switchD_00230f34_caseD_3:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_long_long,_0>
                         ((buffer_appender<char>)local_98,CONCAT44(adapter._12_4_,adapter.arg_id));
    break;
  case 4:
switchD_00230f34_caseD_4:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long_long,_0>
                         ((buffer_appender<char>)local_98,CONCAT44(adapter._12_4_,adapter.arg_id));
    break;
  case 5:
switchD_00230f34_caseD_5:
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ = adapter._12_4_;
    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ = adapter.arg_id;
    value._10_6_ = in_stack_ffffffffffffff62;
    value._0_10_ = in_stack_ffffffffffffff58;
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,___int128,_0>
                         ((detail *)local_98,out,(__int128)value);
    break;
  case 6:
switchD_00230f34_caseD_6:
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._4_4_ =
         adapter._12_4_;
    out_00.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container._0_4_ =
         adapter.arg_id;
    value_00._10_6_ = in_stack_ffffffffffffff62;
    value_00._0_10_ = in_stack_ffffffffffffff58;
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned___int128,_0>
                         ((detail *)local_98,out_00,(unsigned___int128)value_00);
    break;
  case 7:
switchD_00230f34_caseD_7:
    begin_01 = "false";
    if ((ulong)(byte)adapter.arg_id != 0) {
      begin_01 = "true";
    }
    uVar3 = (ulong)(byte)adapter.arg_id ^ 5;
    goto LAB_00231108;
  case 8:
switchD_00230f34_caseD_8:
    local_98 = (buffer<char> *)
               write<char,fmt::v7::detail::buffer_appender<char>>
                         ((buffer_appender<char>)local_98,(byte)adapter.arg_id);
    break;
  case 9:
switchD_00230f34_caseD_9:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                         ((buffer_appender<char>)local_98,(float)adapter.arg_id);
    break;
  case 10:
switchD_00230f34_caseD_a:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                         ((buffer_appender<char>)local_98,
                          (double)CONCAT44(adapter._12_4_,adapter.arg_id));
    break;
  case 0xb:
switchD_00230f34_caseD_b:
    local_98 = (buffer<char> *)
               write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                         ((buffer_appender<char>)local_98,
                          (longdouble)
                          CONCAT28(arg.value_.field_0.int_value._0_2_,
                                   CONCAT44(adapter._12_4_,adapter.arg_id)));
    break;
  case 0xc:
switchD_00230f34_caseD_c:
    local_98 = (buffer<char> *)
               write<char,fmt::v7::detail::buffer_appender<char>>
                         ((buffer_appender<char>)local_98,
                          (char *)CONCAT44(adapter._12_4_,adapter.arg_id));
    break;
  case 0xd:
switchD_00230f34_caseD_d:
    begin_01 = (char *)CONCAT44(adapter._12_4_,adapter.arg_id);
    uVar3 = CONCAT62(arg.value_.field_0.long_long_value._2_6_,arg.value_.field_0.int_value._0_2_);
LAB_00231108:
    buffer<char>::append<char>(local_98,begin_01,begin_01 + uVar3);
    break;
  case 0xe:
switchD_00230f34_caseD_e:
    local_98 = (buffer<char> *)
               write_ptr<char,fmt::v7::detail::buffer_appender<char>,unsigned_long>
                         ((buffer_appender<char>)local_98,CONCAT44(adapter._12_4_,adapter.arg_id),
                          (basic_format_specs<char> *)0x0);
    break;
  case 0xf:
switchD_00230f34_caseD_f:
    local_80 = (handler->context).loc_.locale_;
    local_90 = (undefined4)(handler->context).args_.desc_;
    uStack_8c = *(undefined4 *)((long)&(handler->context).args_.desc_ + 4);
    uStack_88 = *(undefined4 *)&(handler->context).args_.field_1;
    uStack_84 = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    (*(code *)CONCAT62(arg.value_.field_0.long_long_value._2_6_,arg.value_.field_0.int_value._0_2_))
              (CONCAT44(adapter._12_4_,adapter.arg_id),&local_78,&local_98);
  }
LAB_00231135:
  (handler->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       local_98;
LAB_00231138:
  return (char *)(begin_00 + 1);
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (static_cast<char>(*begin) == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}